

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLNode * __thiscall tinyxml2::XMLComment::ShallowClone(XMLComment *this,XMLDocument *doc)

{
  char *str;
  XMLNode *pXVar1;
  
  if (doc == (XMLDocument *)0x0) {
    doc = (this->super_XMLNode)._document;
  }
  str = XMLNode::Value(&this->super_XMLNode);
  pXVar1 = &XMLDocument::NewComment(doc,str)->super_XMLNode;
  return pXVar1;
}

Assistant:

XMLNode* XMLComment::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLComment* comment = doc->NewComment( Value() );	// fixme: this will always allocate memory. Intern?
    return comment;
}